

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O2

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U> *this,deUintptr newSize)

{
  ulong uVar1;
  void **ppvVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 *puVar5;
  deUintptr val_1;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  deUintptr ndx;
  deUintptr dVar9;
  ulong uVar10;
  deUintptr val;
  deUintptr ndx_1;
  deUintptr dVar11;
  bool bVar12;
  
  dVar11 = this->m_numElements;
  uVar7 = newSize;
  if (newSize < dVar11) {
    for (; uVar7 < dVar11; uVar7 = uVar7 + 1) {
      vkt::anon_unknown_0::BuildSpirVAsmTask::~BuildSpirVAsmTask
                ((BuildSpirVAsmTask *)
                 ((ulong)((uint)uVar7 & 0xf) * 0x30 + (long)this->m_pageTable[uVar7 >> 4]));
      dVar11 = this->m_numElements;
    }
    this->m_numElements = newSize;
  }
  else if (dVar11 < newSize) {
    uVar7 = this->m_capacity;
    if (uVar7 <= newSize) {
      uVar1 = newSize + 0xf >> 4;
      uVar4 = 0;
      ppvVar6 = (void **)0x0;
      if (this->m_pageTableCapacity < uVar1) {
        uVar10 = this->m_pageTableCapacity * 2;
        if (uVar10 <= uVar1) {
          uVar10 = uVar1;
        }
        ppvVar2 = (void **)MemPool::alloc(this->m_pool,uVar10 * 8);
        uVar4 = this->m_pageTableCapacity;
        for (uVar7 = 0; uVar8 = uVar4, uVar4 != uVar7; uVar7 = uVar7 + 1) {
          ppvVar2[uVar7] = this->m_pageTable[uVar7];
        }
        for (; uVar8 < uVar10; uVar8 = uVar8 + 1) {
          ppvVar2[uVar8] = (void *)0x0;
        }
        uVar7 = this->m_capacity;
        ppvVar6 = this->m_pageTable;
        uVar4 = uVar4 << 3;
        this->m_pageTable = ppvVar2;
        this->m_pageTableCapacity = uVar10;
      }
      uVar10 = uVar7 >> 4;
      dVar9 = uVar7 & 0xfffffffffffffff0;
      while( true ) {
        pvVar3 = (void *)((long)ppvVar6 + 7U & 0xfffffffffffffff8);
        uVar7 = (long)pvVar3 + (0x300 - (long)ppvVar6);
        bVar12 = uVar4 < uVar7;
        uVar4 = uVar4 - uVar7;
        if (bVar12) break;
        this->m_pageTable[uVar10] = pvVar3;
        uVar10 = uVar10 + 1;
        ppvVar6 = (void **)((long)pvVar3 + 0x300);
        dVar9 = dVar9 + 0x10;
      }
      for (; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        pvVar3 = MemPool::alignedAlloc(this->m_pool,0x300,8);
        this->m_pageTable[uVar10] = pvVar3;
        dVar9 = dVar9 + 0x10;
      }
      this->m_capacity = dVar9;
    }
    this->m_numElements = newSize;
    for (; dVar11 < newSize; dVar11 = dVar11 + 1) {
      puVar5 = (undefined8 *)
               ((ulong)((uint)dVar11 & 0xf) * 0x30 + (long)this->m_pageTable[dVar11 >> 4]);
      *puVar5 = &PTR_execute_00bc7240;
      puVar5[1] = puVar5 + 3;
      puVar5[2] = 0;
      *(undefined1 *)(puVar5 + 3) = 0;
      puVar5[5] = 0;
      newSize = this->m_numElements;
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}